

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::scatterv_big<std::tuple<int,int,int>>
               (tuple<int,_int,_int> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,
               tuple<int,_int,_int> *out,size_t recv_size,int root,comm *comm)

{
  MPI_Comm poVar1;
  ulong uVar2;
  MPI_Datatype poVar3;
  MPI_Request *ppoVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__last;
  ulong uVar5;
  long lVar6;
  datatype dt_1;
  datatype dt;
  requests reqs;
  
  uVar2 = (ulong)(uint)root;
  reqs._vptr_requests = (_func_int **)&PTR__requests_001641d8;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (comm->m_rank == root) {
    lVar6 = 0;
    __last = sizes;
    for (uVar5 = 0; (long)uVar5 < (long)comm->m_size; uVar5 = uVar5 + 1) {
      dt_1.mpitype = datatype_builder<std::tuple<int,_int,_int>_>::get_type();
      dt_1._vptr_datatype = (_func_int **)&PTR__datatype_001641a8;
      dt_1.builtin = false;
      datatype::contiguous
                (&dt,&dt_1,
                 (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar5]);
      datatype::~datatype(&dt_1);
      poVar3 = dt.mpitype;
      if (uVar2 == uVar5) {
        __last = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (msgs + lVar6 +
                 (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar2]);
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<std::tuple<int,int,int>const*,std::tuple<int,int,int>*>
                  (msgs + lVar6,(tuple<int,_int,_int> *)__last,out);
      }
      else {
        poVar1 = comm->mpi_comm;
        ppoVar4 = requests::add(&reqs);
        __last = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
        MPI_Isend(msgs + lVar6,1,poVar3,uVar5 & 0xffffffff,0x4d2,poVar1,ppoVar4);
      }
      lVar6 = lVar6 + (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar5];
      datatype::~datatype(&dt);
    }
  }
  else {
    dt_1.mpitype = datatype_builder<std::tuple<int,_int,_int>_>::get_type();
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_001641a8;
    dt_1.builtin = false;
    datatype::contiguous(&dt,&dt_1,recv_size);
    datatype::~datatype(&dt_1);
    poVar1 = comm->mpi_comm;
    ppoVar4 = requests::add(&reqs);
    __last = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    MPI_Irecv(out,1,dt.mpitype,uVar2,0x4d2,poVar1,ppoVar4);
    datatype::~datatype(&dt);
  }
  requests::wait(&reqs,__last);
  requests::~requests(&reqs);
  return;
}

Assistant:

void scatterv_big(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        std::size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(msgs+offset, msgs+offset+sizes[i], out);
            } else {
                MPI_Isend(const_cast<T*>(msgs)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_size);
        MPI_Irecv(const_cast<T*>(out), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}